

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# req.c
# Opt level: O1

int req0_pipe_init(void *arg,nni_pipe *pipe,void *s)

{
  nni_aio_init((nni_aio *)((long)arg + 0x208),req0_recv_cb,arg);
  nni_aio_init((nni_aio *)((long)arg + 0x40),req0_send_cb,arg);
  *(undefined8 *)((long)arg + 0x10) = 0;
  *(undefined8 *)((long)arg + 0x18) = 0;
  nni_list_init_offset((nni_list *)((long)arg + 0x20),0x28);
  *(nni_pipe **)arg = pipe;
  *(void **)((long)arg + 8) = s;
  return 0;
}

Assistant:

static int
req0_pipe_init(void *arg, nni_pipe *pipe, void *s)
{
	req0_pipe *p = arg;

	nni_aio_init(&p->aio_recv, req0_recv_cb, p);
	nni_aio_init(&p->aio_send, req0_send_cb, p);
	NNI_LIST_NODE_INIT(&p->node);
	NNI_LIST_INIT(&p->contexts, req0_ctx, pipe_node);
	p->pipe = pipe;
	p->req  = s;
	return (0);
}